

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_handshake.c
# Opt level: O2

int nn_ws_validate_value(char *expected,char *subj,size_t subj_len,int case_insensitive)

{
  char cVar1;
  char cVar2;
  size_t sVar3;
  __int32_t **pp_Var4;
  int iVar5;
  long lVar6;
  
  sVar3 = strlen(expected);
  if (sVar3 == subj_len) {
    iVar5 = 1;
    for (lVar6 = 0;
        (cVar1 = expected[lVar6], (long)cVar1 != 0 && (cVar2 = subj[lVar6], (long)cVar2 != 0));
        lVar6 = lVar6 + 1) {
      pp_Var4 = __ctype_tolower_loc();
      if ((*pp_Var4)[cVar1] != (*pp_Var4)[cVar2]) goto LAB_0015d237;
    }
  }
  else {
LAB_0015d237:
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static int nn_ws_validate_value (const char* expected, const char *subj,
    size_t subj_len, int case_insensitive)
{
    if (strlen (expected) != subj_len)
        return NN_WS_HANDSHAKE_NOMATCH;

    if (case_insensitive) {
        while (*expected && *subj) {
            if (tolower (*expected) != tolower (*subj))
                return NN_WS_HANDSHAKE_NOMATCH;
            expected++;
            subj++;
        }
    }
    else {
        while (*expected && *subj) {
            if (*expected != *subj)
                return NN_WS_HANDSHAKE_NOMATCH;
            expected++;
            subj++;
        }
    }

    return NN_WS_HANDSHAKE_MATCH;
}